

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_synchronize(REF_GRID to_grid)

{
  uint uVar1;
  REF_INTERP ref_interp;
  REF_ADJ pRVar2;
  uint uVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong uVar6;
  char *pcVar7;
  
  ref_interp = to_grid->interp;
  uVar3 = 0;
  if (ref_interp != (REF_INTERP)0x0) {
    if (ref_interp->ref_mpi->n < 2) {
      uVar1 = to_grid->node->max;
      uVar3 = 0;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        if ((((-1 < to_grid->node->global[uVar6]) &&
             (pRVar2 = to_grid->cell[3]->ref_adj, (long)uVar6 < (long)pRVar2->nnode)) &&
            (pRVar2->first[uVar6] != -1)) &&
           (((pRVar2 = to_grid->cell[8]->ref_adj, (long)uVar6 < (long)pRVar2->nnode &&
             (pRVar2->first[uVar6] != -1)) && (ref_interp->cell[uVar6] == -1)))) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x2c8,"ref_metric_synchronize","should be located");
          return 1;
        }
      }
    }
    else {
      uVar3 = ref_interp_locate_warm(ref_interp);
      if (uVar3 == 0) {
        uVar3 = ref_metric_interpolate(ref_interp);
        if (uVar3 == 0) {
          return 0;
        }
        pcVar7 = "interp";
        uVar5 = 0x2c2;
      }
      else {
        pcVar7 = "map from existing";
        uVar5 = 0x2c1;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar5,"ref_metric_synchronize",(ulong)uVar3,pcVar7);
    }
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_metric_synchronize(REF_GRID to_grid) {
  REF_INTERP ref_interp = ref_grid_interp(to_grid);
  REF_MPI ref_mpi;
  REF_INT node;
  REF_DBL max_error, tol = 1.0e-8;
  REF_BOOL report_interp_error = REF_FALSE;

  if (NULL == ref_interp) return REF_SUCCESS;

  ref_mpi = ref_interp_mpi(ref_interp);

  if (ref_mpi_para(ref_mpi)) {
    /* parallel can miss on partition boundaries, refresh interp */
    RSS(ref_interp_locate_warm(ref_interp), "map from existing");
    RSS(ref_metric_interpolate(ref_interp), "interp");
  } else {
    /* sequential should always localized unless mixed, assert */
    each_ref_node_valid_node(ref_grid_node(to_grid), node) {
      if (!ref_cell_node_empty(ref_grid_tri(to_grid), node) &&
          !ref_cell_node_empty(ref_grid_tet(to_grid), node)) {
        RUS(REF_EMPTY, ref_interp_cell(ref_interp, node), "should be located");
      }
    }
  }

  if (report_interp_error) {
    RSS(ref_interp_max_error(ref_interp, &max_error), "err");
    if (max_error > tol && ref_mpi_once(ref_mpi)) {
      printf("warning: %e max_error greater than %e tol\n", max_error, tol);
    }
  }

  return REF_SUCCESS;
}